

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetDebugAttach
          (zet_device_handle_t hDevice,zet_debug_config_t *config,
          zet_debug_session_handle_t *phDebug)

{
  zet_debug_session_handle_t p_Var1;
  zet_pfnDebugAttach_t pfnAttach;
  ze_result_t result;
  zet_debug_session_handle_t *phDebug_local;
  zet_debug_config_t *config_local;
  zet_device_handle_t hDevice_local;
  
  pfnAttach._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c958 == (code *)0x0) {
    p_Var1 = (zet_debug_session_handle_t)context_t::get((context_t *)&context);
    *phDebug = p_Var1;
  }
  else {
    pfnAttach._4_4_ = (*DAT_0011c958)(hDevice,config,phDebug);
  }
  return pfnAttach._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDebugAttach(
        zet_device_handle_t hDevice,                    ///< [in] device handle
        const zet_debug_config_t* config,               ///< [in] the debug configuration
        zet_debug_session_handle_t* phDebug             ///< [out] debug session handle
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnAttach = context.zetDdiTable.Debug.pfnAttach;
        if( nullptr != pfnAttach )
        {
            result = pfnAttach( hDevice, config, phDebug );
        }
        else
        {
            // generic implementation
            *phDebug = reinterpret_cast<zet_debug_session_handle_t>( context.get() );

        }

        return result;
    }